

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseEnum(Parser *this,bool is_union)

{
  Type *type;
  pointer ppEVar1;
  pointer ppEVar2;
  bool bVar3;
  EnumDef *this_00;
  EnumVal *pEVar4;
  StructDef *pSVar5;
  undefined8 extraout_RAX;
  int iVar6;
  undefined7 in_register_00000031;
  allocator local_ed;
  undefined4 local_ec;
  string name_1;
  string dc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string name;
  string dc;
  
  local_ec = (undefined4)CONCAT71(in_register_00000031,is_union);
  std::__cxx11::string::string((string *)&dc,(string *)&this->doc_comment_);
  Next(this);
  std::__cxx11::string::string((string *)&name,(string *)&this->attribute_);
  Expect(this,4);
  this_00 = (EnumDef *)operator_new(0xf8);
  EnumDef::EnumDef(this_00);
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::_M_assign((string *)&(this_00->super_Definition).doc_comment);
  this_00->is_union = SUB41(local_ec,0);
  bVar3 = SymbolTable<flatbuffers::EnumDef>::Add(&this->enums_,&name,this_00);
  if (bVar3) goto LAB_001117fb;
  if ((char)local_ec == '\0') {
    bVar3 = IsNext(this,0x3a);
    type = &this_00->underlying_type;
    if (bVar3) {
      ParseType(this,type);
      if (type->base_type - BASE_TYPE_UTYPE < 10) goto LAB_001115d5;
      std::__cxx11::string::string
                ((string *)&name_1,"underlying enum type must be integral",(allocator *)&dc_1);
      Error(&name_1);
    }
    type->base_type = BASE_TYPE_SHORT;
  }
  else {
    (this_00->underlying_type).base_type = BASE_TYPE_UTYPE;
    (this_00->underlying_type).enum_def = this_00;
  }
LAB_001115d5:
  ParseMetaData(this,(Definition *)this_00);
  Expect(this,0x7b);
  if ((char)local_ec != '\0') {
    std::__cxx11::string::string((string *)&name_1,"NONE",(allocator *)&local_90);
    pEVar4 = (EnumVal *)operator_new(0x50);
    std::__cxx11::string::string((string *)&dc_1,"NONE",&local_ed);
    EnumVal::EnumVal(pEVar4,&dc_1,0);
    SymbolTable<flatbuffers::EnumVal>::Add(&this_00->vals,&name_1,pEVar4);
    std::__cxx11::string::~string((string *)&dc_1);
    std::__cxx11::string::~string((string *)&name_1);
  }
  while( true ) {
    std::__cxx11::string::string((string *)&name_1,(string *)&this->attribute_);
    std::__cxx11::string::string((string *)&dc_1,(string *)&this->doc_comment_);
    Expect(this,4);
    ppEVar1 = (this_00->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this_00->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pEVar4 = (EnumVal *)operator_new(0x50);
    if (ppEVar2 == ppEVar1) {
      iVar6 = 0;
    }
    else {
      iVar6 = ppEVar2[-1]->value + 1;
    }
    EnumVal::EnumVal(pEVar4,&name_1,iVar6);
    bVar3 = SymbolTable<flatbuffers::EnumVal>::Add(&this_00->vals,&name_1,pEVar4);
    if (bVar3) break;
    std::__cxx11::string::_M_assign((string *)&pEVar4->doc_comment);
    if ((char)local_ec != '\0') {
      pSVar5 = LookupCreateStruct(this,&name_1);
      pEVar4->struct_def = pSVar5;
    }
    bVar3 = IsNext(this,0x3d);
    if (bVar3) {
      iVar6 = atoi((this->attribute_)._M_dataplus._M_p);
      pEVar4->value = iVar6;
      Expect(this,2);
      if ((ppEVar2 != ppEVar1) &&
         (pEVar4->value <=
          *(int *)(*(long *)((long)ppEVar2 +
                            (long)(this_00->vals).vec.
                                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (-8 - (long)ppEVar1))
                  + 0x40))) goto LAB_001117db;
    }
    std::__cxx11::string::~string((string *)&dc_1);
    std::__cxx11::string::~string((string *)&name_1);
    bVar3 = IsNext(this,0x2c);
    if (!bVar3) {
      Expect(this,0x7d);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&dc);
      return;
    }
  }
  std::operator+(&local_90,"enum value already exists: ",&name_1);
  Error(&local_90);
LAB_001117db:
  std::__cxx11::string::string
            ((string *)&local_90,"enum values must be specified in ascending order",&local_ed);
  Error(&local_90);
LAB_001117fb:
  std::operator+(&name_1,"enum already exists: ",&name);
  Error(&name_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&dc);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseEnum(bool is_union) {
  std::string dc = doc_comment_;
  Next();
  std::string name = attribute_;
  Expect(kTokenIdentifier);
  auto &enum_def = *new EnumDef();
  enum_def.name = name;
  enum_def.doc_comment = dc;
  enum_def.is_union = is_union;
  if (enums_.Add(name, &enum_def)) Error("enum already exists: " + name);
  if (is_union) {
    enum_def.underlying_type.base_type = BASE_TYPE_UTYPE;
    enum_def.underlying_type.enum_def = &enum_def;
  } else if (IsNext(':')) {
    // short is the default type for fields when you use enums,
    // though people are encouraged to pick any integer type instead.
    ParseType(enum_def.underlying_type);
    if (!IsInteger(enum_def.underlying_type.base_type))
      Error("underlying enum type must be integral");
  } else {
    enum_def.underlying_type.base_type = BASE_TYPE_SHORT;
  }
  ParseMetaData(enum_def);
  Expect('{');
  if (is_union) enum_def.vals.Add("NONE", new EnumVal("NONE", 0));
  do {
    std::string name = attribute_;
    std::string dc = doc_comment_;
    Expect(kTokenIdentifier);
    auto prevsize = enum_def.vals.vec.size();
    auto &ev = *new EnumVal(name, static_cast<int>(
                      enum_def.vals.vec.size()
                        ? enum_def.vals.vec.back()->value + 1
                        : 0));
    if (enum_def.vals.Add(name, &ev))
      Error("enum value already exists: " + name);
    ev.doc_comment = dc;
    if (is_union) {
      ev.struct_def = LookupCreateStruct(name);
    }
    if (IsNext('=')) {
      ev.value = atoi(attribute_.c_str());
      Expect(kTokenIntegerConstant);
      if (prevsize && enum_def.vals.vec[prevsize - 1]->value >= ev.value)
        Error("enum values must be specified in ascending order");
    }
  } while (IsNext(','));
  Expect('}');
}